

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O3

void __thiscall helics::apps::AsioBrokerServer::mainLoop(AsioBrokerServer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  undefined1 local_88 [32];
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  pointer local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_88._8_8_ = (element_type *)0x0;
  local_88[0x10] = '\0';
  local_88._0_8_ = (element_type *)(local_88 + 0x10);
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)(local_88 + 0x20),(string *)local_88);
  if ((element_type *)local_88._0_8_ != (element_type *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,CONCAT71(local_88._17_7_,local_88[0x10]) + 1);
  }
  if (this->tcp_enabled_ == true) {
    loadTCPserver((AsioBrokerServer *)local_88,(io_context *)this);
    uVar3 = local_88._8_8_;
    uVar2 = local_88._0_8_;
    local_88._0_8_ = (element_type *)0x0;
    local_88._8_8_ = (element_type *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->tcpserver).
             super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    (this->tcpserver).super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar2;
    (this->tcpserver).super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
    }
    local_30._8_8_ = 0;
    local_18 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:284:17)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:284:17)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::operator=(&((this->tcpserver).
                  super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->dataCall,
                (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                 *)&local_30);
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,3);
    }
    loadTCPServerData(&this->tcpPortData);
    gmlc::networking::TcpServer::start
              ((this->tcpserver).
               super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (this->udp_enabled_ == true) {
    loadUDPserver((AsioBrokerServer *)local_88,(io_context *)this);
    uVar3 = local_88._8_8_;
    uVar2 = local_88._0_8_;
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (element_type *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->udpserver).
             super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->udpserver).super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)uVar2;
    (this->udpserver).super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
    }
    local_50._8_8_ = (pointer)0x0;
    local_38 = std::
               _Function_handler<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:297:17)>
               ::_M_invoke;
    local_40 = (pointer)std::
                        _Function_handler<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/AsioBrokerServer.cpp:297:17)>
                        ::_M_manager;
    local_50._0_8_ = this;
    std::function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>::
    operator=(&((this->udpserver).
                super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mDataCall,
              (function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>
               *)(local_68 + 0x18));
    if (local_40 != (pointer)0x0) {
      (*(code *)local_40)(local_68 + 0x18,local_68 + 0x18,3);
    }
    loadUDPServerData(&this->udpPortData);
    local_68._16_8_ =
         (this->udpserver).super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_88._0_8_ = &((element_type *)local_68._16_8_)->mRecvBuffer;
    local_88._8_8_ = (element_type *)0x400;
    ::asio::detail::reactive_socket_service<asio::ip::udp>::
    async_receive_from<asio::mutable_buffers_1,helics::udp::UdpServer::start_receive()::_lambda(std::error_code_const&,unsigned_long)_1_,asio::any_io_executor>
              ((((element_type *)local_68._16_8_)->mSocket).
               super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.service_,
               &(((element_type *)local_68._16_8_)->mSocket).
                super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.implementation_,
               (mutable_buffers_1 *)local_88,&((element_type *)local_68._16_8_)->mRemoteEndpoint,0,
               (type *)(local_68 + 0x10),
               &(((element_type *)local_68._16_8_)->mSocket).
                super_basic_socket<asio::ip::udp,_asio::any_io_executor>.impl_.executor_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return;
}

Assistant:

void AsioBrokerServer::mainLoop()
    {
#if defined(HELICS_ENABLE_TCP_CORE) || defined(HELICS_ENABLE_UDP_CORE)
        auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
#endif

#ifdef HELICS_ENABLE_TCP_CORE
        if (tcp_enabled_) {
            tcpserver = loadTCPserver(ioctx->getBaseContext());
            tcpserver->setDataCall(
                // NOLINTNEXTLINE
                [this](gmlc::networking::TcpConnection::pointer connection,
                       const char* data,
                       size_t datasize) { return tcpDataReceive(connection, data, datasize); });

            loadTCPServerData(tcpPortData);
            tcpserver->start();
        }
#endif
#ifdef HELICS_ENABLE_UDP_CORE
        if (udp_enabled_) {
            udpserver = loadUDPserver(ioctx->getBaseContext());
            udpserver->setDataCall(
                // NOLINTNEXTLINE
                [this](std::shared_ptr<udp::UdpServer> server, const char* data, size_t datasize) {
                    return udpDataReceive(server, data, datasize);
                });

            loadUDPServerData(udpPortData);
            udpserver->start_receive();
        }
#endif
    }